

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

bool anon_unknown.dwarf_41b5d::GetSourceiv
               (ALsource *Source,ALCcontext *Context,SourceProp prop,
               span<int,_18446744073709551615UL> values)

{
  DistanceModel DVar1;
  Resampler RVar2;
  ALenum AVar3;
  int iVar4;
  ALbuffer *pAVar5;
  ALuint *pAVar6;
  Voice *voice_00;
  index_type iVar7;
  uint *puVar8;
  DistanceModel *pDVar9;
  Resampler *pRVar10;
  reference piVar11;
  uint in_EDX;
  ALCcontext *in_RSI;
  ALsource *in_RDI;
  bool bVar12;
  SourceProp in_stack_0000008c;
  ALCcontext *in_stack_00000090;
  ALsource *in_stack_00000098;
  span<double,_18446744073709551615UL> in_stack_000000a0;
  Voice *voice;
  ALsizei played;
  BufferlistItem *Current;
  BufferlistItem *BufferList_2;
  ALsizei count;
  BufferlistItem *BufferList_1;
  BufferStorage *buffer;
  BufferlistItem *BufferList;
  bool err;
  double dvals [6];
  memory_order in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  ALCcontext *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  DirectMode mode;
  undefined8 in_stack_fffffffffffffd70;
  ALuint local_12c;
  span<double,_18446744073709551615UL> local_c0;
  Voice *local_b0;
  int local_a4;
  __pointer_type local_a0;
  __pointer_type local_98;
  int local_8c;
  __pointer_type local_88;
  BufferStorage *local_80;
  BufferlistItem *local_78;
  byte local_69;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  uint local_2c;
  ALCcontext *local_28;
  ALsource *local_20;
  span<int,_18446744073709551615UL> local_18;
  bool local_1;
  
  mode = (DirectMode)((ulong)in_stack_fffffffffffffd70 >> 0x18);
  local_2c = in_EDX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  if (in_EDX == 0x202) {
    iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
    bVar12 = true;
    if (iVar7 != 1) {
      iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
      bVar12 = iVar7 == 6;
    }
    if (bVar12) {
      bVar12 = local_20->HeadRelative;
      puVar8 = (uint *)al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
      *puVar8 = (uint)(bVar12 & 1);
      return true;
    }
    iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
    ALCcontext::setError
              (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
               iVar7);
    return false;
  }
  if (2 < in_EDX - 0x1001) {
    if (in_EDX - 0x1004 < 3) {
      iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
      bVar12 = true;
      if (iVar7 != 3) {
        iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
        bVar12 = iVar7 == 6;
      }
      if (bVar12) {
        al::span<double,_18446744073709551615UL>::span
                  ((span<double,_18446744073709551615UL> *)&stack0xffffffffffffff30,&local_68,3);
        local_69 = GetSourcedv(in_stack_00000098,in_stack_00000090,in_stack_0000008c,
                               in_stack_000000a0);
        if ((bool)local_69) {
          piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
          *piVar11 = (int)local_68;
          piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,1);
          *piVar11 = (int)local_60;
          piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,2);
          *piVar11 = (int)local_58;
        }
        return (bool)(local_69 & 1);
      }
      iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,3,
                 iVar7);
      return false;
    }
    if (in_EDX == 0x1007) {
      iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
      bVar12 = true;
      if (iVar7 != 1) {
        iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
        bVar12 = iVar7 == 6;
      }
      if (bVar12) {
        bVar12 = local_20->Looping;
        puVar8 = (uint *)al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
        *puVar8 = (uint)(bVar12 & 1);
        return true;
      }
      iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar7);
      return false;
    }
    if (in_EDX == 0x1009) {
      iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
      bVar12 = true;
      if (iVar7 != 1) {
        iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
        bVar12 = iVar7 == 6;
      }
      if (bVar12) {
        local_78 = (BufferlistItem *)0x0;
        if (local_20->SourceType == 0x1028) {
          local_78 = local_20->queue;
        }
        local_80 = (BufferStorage *)0x0;
        if (local_78 != (BufferlistItem *)0x0) {
          local_80 = local_78->mBuffer;
        }
        if (local_80 == (BufferStorage *)0x0) {
          local_12c = 0;
        }
        else {
          pAVar5 = BufferFromStorage(local_80);
          local_12c = pAVar5->id;
        }
        pAVar6 = (ALuint *)al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
        *pAVar6 = local_12c;
        return true;
      }
      iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
      ALCcontext::setError
                (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                 iVar7);
      return false;
    }
    if ((in_EDX != 0x100a) && (1 < in_EDX - 0x100d)) {
      if (in_EDX == 0x100f) {
        iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
        bVar12 = true;
        if (iVar7 != 6) {
          iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
          bVar12 = iVar7 == 6;
        }
        if (bVar12) {
          al::span<double,_18446744073709551615UL>::span
                    ((span<double,_18446744073709551615UL> *)&stack0xffffffffffffff20,&local_68,6);
          local_69 = GetSourcedv(in_stack_00000098,in_stack_00000090,in_stack_0000008c,
                                 in_stack_000000a0);
          if ((bool)local_69) {
            piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
            *piVar11 = (int)local_68;
            piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,1);
            *piVar11 = (int)local_60;
            piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,2);
            *piVar11 = (int)local_58;
            iVar4 = (int)local_50;
            piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,3);
            *piVar11 = iVar4;
            iVar4 = (int)local_48;
            piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,4);
            *piVar11 = iVar4;
            iVar4 = (int)local_40;
            piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,5);
            *piVar11 = iVar4;
          }
          return (bool)(local_69 & 1);
        }
        iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
        ALCcontext::setError
                  (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,6,
                   iVar7);
        return false;
      }
      if (in_EDX == 0x1010) {
        iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
        bVar12 = true;
        if (iVar7 != 1) {
          iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
          bVar12 = iVar7 == 6;
        }
        if (bVar12) {
          voice_00 = GetSourceVoice((ALsource *)
                                    CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                                    in_stack_fffffffffffffd48);
          AVar3 = GetSourceState(local_20,voice_00);
          piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
          *piVar11 = AVar3;
          return true;
        }
        iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
        ALCcontext::setError
                  (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                   iVar7);
        return false;
      }
      if (in_EDX == 0x1015) {
        iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
        bVar12 = true;
        if (iVar7 != 1) {
          iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
          bVar12 = iVar7 == 6;
        }
        if (bVar12) {
          local_88 = local_20->queue;
          if (local_88 == (__pointer_type)0x0) {
            piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
            *piVar11 = 0;
          }
          else {
            local_8c = 0;
            do {
              local_8c = local_8c + 1;
              local_88 = std::atomic<BufferlistItem_*>::load
                                   ((atomic<BufferlistItem_*> *)
                                    CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                    in_stack_fffffffffffffd24);
              iVar4 = local_8c;
            } while (local_88 != (__pointer_type)0x0);
            piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
            *piVar11 = iVar4;
          }
          return true;
        }
        iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
        ALCcontext::setError
                  (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                   iVar7);
        return false;
      }
      if (in_EDX == 0x1016) {
        iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
        bVar12 = true;
        if (iVar7 != 1) {
          iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
          bVar12 = iVar7 == 6;
        }
        if (bVar12) {
          if (((local_20->Looping & 1U) == 0) && (local_20->SourceType == 0x1029)) {
            local_98 = local_20->queue;
            local_a0 = (__pointer_type)0x0;
            local_a4 = 0;
            local_b0 = GetSourceVoice((ALsource *)
                                      CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                                      in_stack_fffffffffffffd48);
            if (local_b0 == (Voice *)0x0) {
              if (local_20->state == 0x1011) {
                local_a0 = local_98;
              }
            }
            else {
              local_a0 = std::atomic<BufferlistItem_*>::load
                                   ((atomic<BufferlistItem_*> *)
                                    CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                    in_stack_fffffffffffffd24);
            }
            while (iVar4 = local_a4, local_98 != (__pointer_type)0x0 && local_98 != local_a0) {
              local_a4 = local_a4 + 1;
              local_98 = std::atomic<BufferlistItem_*>::load
                                   ((atomic<BufferlistItem_*> *)
                                    CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                    in_stack_fffffffffffffd24);
            }
            piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
            *piVar11 = iVar4;
          }
          else {
            piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
            *piVar11 = 0;
          }
          return true;
        }
        iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
        ALCcontext::setError
                  (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
                   iVar7);
        return false;
      }
      if (6 < in_EDX - 0x1020) {
        if (in_EDX == 0x1027) {
          iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
          bVar12 = true;
          if (iVar7 != 1) {
            iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
            bVar12 = iVar7 == 6;
          }
          if (bVar12) {
            iVar4 = local_20->SourceType;
            piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
            *piVar11 = iVar4;
            return true;
          }
          iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
          ALCcontext::setError
                    (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,
                     1,iVar7);
          return false;
        }
        if (in_EDX != 0x1030) {
          if (in_EDX == 0x1031) goto LAB_0016a61b;
          if (in_EDX == 0x1033) {
            iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
            bVar12 = true;
            if (iVar7 != 1) {
              iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
              bVar12 = iVar7 == 6;
            }
            if (bVar12) {
              AVar3 = EnumFromDirectMode(mode);
              piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
              *piVar11 = AVar3;
              return true;
            }
            iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
            ALCcontext::setError
                      (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                       (ulong)local_2c,1,iVar7);
            return false;
          }
          if ((((in_EDX != 0x1200) && (in_EDX != 0x1201)) && (in_EDX != 0x1202)) &&
             (in_EDX != 0x1203)) {
            if (in_EDX == 0x1212) {
              iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
              bVar12 = true;
              if (iVar7 != 1) {
                iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
                bVar12 = iVar7 == 6;
              }
              if (bVar12) {
                RVar2 = local_20->mResampler;
                pRVar10 = (Resampler *)
                          al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
                *pRVar10 = RVar2;
                return true;
              }
              iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
              ALCcontext::setError
                        (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                         (ulong)local_2c,1,iVar7);
              return false;
            }
            if (in_EDX == 0x1214) {
              iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
              bVar12 = true;
              if (iVar7 != 1) {
                iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
                bVar12 = iVar7 == 6;
              }
              if (bVar12) {
                AVar3 = EnumFromSpatializeMode(mode);
                piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
                *piVar11 = AVar3;
                return true;
              }
              iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
              ALCcontext::setError
                        (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                         (ulong)local_2c,1,iVar7);
              return false;
            }
            if (in_EDX == 0xc000) goto LAB_0016a61b;
            if (in_EDX == 0xd000) {
              iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
              bVar12 = true;
              if (iVar7 != 1) {
                iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
                bVar12 = iVar7 == 6;
              }
              if (bVar12) {
                DVar1 = local_20->mDistanceModel;
                pDVar9 = (DistanceModel *)
                         al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
                *pDVar9 = DVar1;
                return true;
              }
              iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
              ALCcontext::setError
                        (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                         (ulong)local_2c,1,iVar7);
              return false;
            }
            if (1 < in_EDX - 0x20005) {
              if (in_EDX - 0x20007 < 3) goto LAB_0016a61b;
              if (in_EDX == 0x2000a) {
                iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
                bVar12 = true;
                if (iVar7 != 1) {
                  iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
                  bVar12 = iVar7 == 6;
                }
                if (bVar12) {
                  bVar12 = local_20->DryGainHFAuto;
                  puVar8 = (uint *)al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
                  *puVar8 = (uint)(bVar12 & 1);
                  return true;
                }
                iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
                ALCcontext::setError
                          (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                           (ulong)local_2c,1,iVar7);
                return false;
              }
              if (in_EDX == 0x2000b) {
                iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
                bVar12 = true;
                if (iVar7 != 1) {
                  iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
                  bVar12 = iVar7 == 6;
                }
                if (bVar12) {
                  bVar12 = local_20->WetGainAuto;
                  puVar8 = (uint *)al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
                  *puVar8 = (uint)(bVar12 & 1);
                  return true;
                }
                iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
                ALCcontext::setError
                          (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                           (ulong)local_2c,1,iVar7);
                return false;
              }
              if (in_EDX == 0x2000c) {
                iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
                bVar12 = true;
                if (iVar7 != 1) {
                  iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
                  bVar12 = iVar7 == 6;
                }
                if (bVar12) {
                  bVar12 = local_20->WetGainHFAuto;
                  puVar8 = (uint *)al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
                  *puVar8 = (uint)(bVar12 & 1);
                  return true;
                }
                iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
                ALCcontext::setError
                          (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",
                           (ulong)local_2c,1,iVar7);
                return false;
              }
            }
          }
        }
        if (0 < (int)gLogLevel) {
          fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Unexpected property: 0x%04x\n",(ulong)in_EDX);
        }
        ALCcontext::setError
                  (local_28,0xa002,"Invalid source integer property 0x%04x",(ulong)local_2c);
        return false;
      }
    }
  }
LAB_0016a61b:
  iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
  bVar12 = true;
  if (iVar7 != 1) {
    iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
    bVar12 = iVar7 == 6;
  }
  if (bVar12) {
    al::span<double,_18446744073709551615UL>::span(&local_c0,&local_68,1);
    local_69 = GetSourcedv(in_stack_00000098,in_stack_00000090,in_stack_0000008c,in_stack_000000a0);
    if ((bool)local_69) {
      piVar11 = al::span<int,_18446744073709551615UL>::operator[](&local_18,0);
      *piVar11 = (int)local_68;
    }
    local_1 = (bool)(local_69 & 1);
  }
  else {
    iVar7 = al::span<int,_18446744073709551615UL>::size(&local_18);
    ALCcontext::setError
              (local_28,0xa002,"Property 0x%04x expects %d value(s), got %zu",(ulong)local_2c,1,
               iVar7);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool GetSourceiv(ALsource *Source, ALCcontext *Context, SourceProp prop, const al::span<int> values)
{
    double dvals[MaxValues];
    bool err;

    switch(prop)
    {
    case AL_SOURCE_RELATIVE:
        CHECKSIZE(values, 1);
        values[0] = Source->HeadRelative;
        return true;

    case AL_LOOPING:
        CHECKSIZE(values, 1);
        values[0] = Source->Looping;
        return true;

    case AL_BUFFER:
        CHECKSIZE(values, 1);
        {
            BufferlistItem *BufferList{nullptr};
            if(Source->SourceType == AL_STATIC) BufferList = Source->queue;
            BufferStorage *buffer{nullptr};
            if(BufferList) buffer = BufferList->mBuffer;
            values[0] = buffer ? static_cast<int>(BufferFromStorage(buffer)->id) : 0;
        }
        return true;

    case AL_SOURCE_STATE:
        CHECKSIZE(values, 1);
        values[0] = GetSourceState(Source, GetSourceVoice(Source, Context));
        return true;

    case AL_BUFFERS_QUEUED:
        CHECKSIZE(values, 1);
        if(BufferlistItem *BufferList{Source->queue})
        {
            ALsizei count{0};
            do {
                ++count;
                BufferList = BufferList->mNext.load(std::memory_order_relaxed);
            } while(BufferList != nullptr);
            values[0] = count;
        }
        else
            values[0] = 0;
        return true;

    case AL_BUFFERS_PROCESSED:
        CHECKSIZE(values, 1);
        if(Source->Looping || Source->SourceType != AL_STREAMING)
        {
            /* Buffers on a looping source are in a perpetual state of PENDING,
             * so don't report any as PROCESSED
             */
            values[0] = 0;
        }
        else
        {
            const BufferlistItem *BufferList{Source->queue};
            const BufferlistItem *Current{nullptr};
            ALsizei played{0};

            Voice *voice{GetSourceVoice(Source, Context)};
            if(voice != nullptr)
                Current = voice->mCurrentBuffer.load(std::memory_order_relaxed);
            else if(Source->state == AL_INITIAL)
                Current = BufferList;

            while(BufferList && BufferList != Current)
            {
                ++played;
                BufferList = BufferList->mNext.load(std::memory_order_relaxed);
            }
            values[0] = played;
        }
        return true;

    case AL_SOURCE_TYPE:
        CHECKSIZE(values, 1);
        values[0] = Source->SourceType;
        return true;

    case AL_DIRECT_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        values[0] = Source->DryGainHFAuto;
        return true;

    case AL_AUXILIARY_SEND_FILTER_GAIN_AUTO:
        CHECKSIZE(values, 1);
        values[0] = Source->WetGainAuto;
        return true;

    case AL_AUXILIARY_SEND_FILTER_GAINHF_AUTO:
        CHECKSIZE(values, 1);
        values[0] = Source->WetGainHFAuto;
        return true;

    case AL_DIRECT_CHANNELS_SOFT:
        CHECKSIZE(values, 1);
        values[0] = EnumFromDirectMode(Source->DirectChannels);
        return true;

    case AL_DISTANCE_MODEL:
        CHECKSIZE(values, 1);
        values[0] = static_cast<int>(Source->mDistanceModel);
        return true;

    case AL_SOURCE_RESAMPLER_SOFT:
        CHECKSIZE(values, 1);
        values[0] = static_cast<int>(Source->mResampler);
        return true;

    case AL_SOURCE_SPATIALIZE_SOFT:
        CHECKSIZE(values, 1);
        values[0] = EnumFromSpatializeMode(Source->mSpatialize);
        return true;

    /* 1x float/double */
    case AL_CONE_INNER_ANGLE:
    case AL_CONE_OUTER_ANGLE:
    case AL_PITCH:
    case AL_GAIN:
    case AL_MIN_GAIN:
    case AL_MAX_GAIN:
    case AL_REFERENCE_DISTANCE:
    case AL_ROLLOFF_FACTOR:
    case AL_CONE_OUTER_GAIN:
    case AL_MAX_DISTANCE:
    case AL_SEC_OFFSET:
    case AL_SAMPLE_OFFSET:
    case AL_BYTE_OFFSET:
    case AL_DOPPLER_FACTOR:
    case AL_AIR_ABSORPTION_FACTOR:
    case AL_ROOM_ROLLOFF_FACTOR:
    case AL_CONE_OUTER_GAINHF:
    case AL_SOURCE_RADIUS:
        CHECKSIZE(values, 1);
        if((err=GetSourcedv(Source, Context, prop, {dvals, 1u})) != false)
            values[0] = static_cast<int>(dvals[0]);
        return err;

    /* 3x float/double */
    case AL_POSITION:
    case AL_VELOCITY:
    case AL_DIRECTION:
        CHECKSIZE(values, 3);
        if((err=GetSourcedv(Source, Context, prop, {dvals, 3u})) != false)
        {
            values[0] = static_cast<int>(dvals[0]);
            values[1] = static_cast<int>(dvals[1]);
            values[2] = static_cast<int>(dvals[2]);
        }
        return err;

    /* 6x float/double */
    case AL_ORIENTATION:
        CHECKSIZE(values, 6);
        if((err=GetSourcedv(Source, Context, prop, {dvals, 6u})) != false)
        {
            values[0] = static_cast<int>(dvals[0]);
            values[1] = static_cast<int>(dvals[1]);
            values[2] = static_cast<int>(dvals[2]);
            values[3] = static_cast<int>(dvals[3]);
            values[4] = static_cast<int>(dvals[4]);
            values[5] = static_cast<int>(dvals[5]);
        }
        return err;

    case AL_SAMPLE_OFFSET_LATENCY_SOFT:
    case AL_SAMPLE_OFFSET_CLOCK_SOFT:
        break; /* i64 only */
    case AL_SEC_OFFSET_LATENCY_SOFT:
    case AL_SEC_OFFSET_CLOCK_SOFT:
        break; /* Double only */
    case AL_STEREO_ANGLES:
        break; /* Float/double only */

    case AL_DIRECT_FILTER:
    case AL_AUXILIARY_SEND_FILTER:
        break; /* ??? */
    }

    ERR("Unexpected property: 0x%04x\n", prop);
    Context->setError(AL_INVALID_ENUM, "Invalid source integer property 0x%04x", prop);
    return false;
}